

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngineTest.cpp
# Opt level: O3

Task * __thiscall
(anonymous_namespace)::BuildEngineTest_CycleDuringScanningFromTop_Test::TestBody()::CycleRule::
createTask(llbuild::core::BuildEngine__(void *this,BuildEngine *param_1)

{
  SimpleTask *this_00;
  _Any_data local_58;
  code *local_48;
  undefined8 uStack_40;
  _Any_data local_38;
  code *local_28;
  undefined8 uStack_20;
  
  this_00 = (SimpleTask *)operator_new(0x60);
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_48 = (code *)0x0;
  uStack_40 = 0;
  if (*(code **)((long)this + 0x40) != (code *)0x0) {
    (**(code **)((long)this + 0x40))(&local_58,(long)this + 0x30,2);
    local_48 = *(code **)((long)this + 0x40);
    uStack_40 = *(undefined8 *)((long)this + 0x48);
  }
  local_28 = (code *)0x0;
  uStack_20 = 0;
  local_38._M_unused._M_object = (void *)0x0;
  local_38._8_8_ = 0;
  if (*(code **)((long)this + 0x60) != (code *)0x0) {
    (**(code **)((long)this + 0x60))(&local_38,(long)this + 0x50,2);
    local_28 = *(code **)((long)this + 0x60);
    uStack_20 = *(undefined8 *)((long)this + 0x68);
  }
  anon_unknown.dwarf_1cb45::SimpleTask::SimpleTask
            (this_00,(InputListingFnType *)&local_58,(ComputeFnType *)&local_38);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  return &this_00->super_Task;
}

Assistant:

Task* createTask(BuildEngine&) override {
      return new SimpleTask(input, compute);
    }